

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dnrm2.c
# Opt level: O0

double dnrm2_(int *n,double *x,int *incx)

{
  long lVar1;
  long lVar2;
  double dVar3;
  double temp;
  double ssq;
  double absxi;
  double scale;
  double norm;
  long iincx;
  long nn;
  long ix;
  int *incx_local;
  double *x_local;
  int *n_local;
  
  lVar1 = (long)*n;
  lVar2 = (long)*incx;
  if ((lVar1 < 1) || (lVar2 < 1)) {
    scale = 0.0;
  }
  else if (lVar1 == 1) {
    scale = ABS(*x);
  }
  else {
    absxi = 0.0;
    temp = 1.0;
    for (nn = (lVar1 + -1) * lVar2; -1 < nn; nn = nn - lVar2) {
      if ((x[nn] != 0.0) || (NAN(x[nn]))) {
        dVar3 = ABS(x[nn]);
        if (dVar3 <= absxi) {
          temp = (dVar3 / absxi) * (dVar3 / absxi) + temp;
        }
        else {
          temp = temp * (absxi / dVar3) * (absxi / dVar3) + 1.0;
          absxi = dVar3;
        }
      }
    }
    dVar3 = sqrt(temp);
    scale = absxi * dVar3;
  }
  return scale;
}

Assistant:

double dnrm2_(int *n, double *x, int *incx)
{
  long int ix, nn, iincx;
  double norm, scale, absxi, ssq, temp;

/*  DNRM2 returns the euclidean norm of a vector via the function   
    name, so that   

       DNRM2 := sqrt( x'*x )   

    -- This version written on 25-October-1982.   
       Modified on 14-October-1993 to inline the call to SLASSQ.   
       Sven Hammarling, Nag Ltd.   */

  /* Dereference inputs */
  nn = *n;
  iincx = *incx;

  if( nn > 0 && iincx > 0 )
  {
    if (nn == 1)
    {
      norm = fabs(x[0]);
    }  
    else
    {
      scale = 0.0;
      ssq = 1.0;

      /* The following loop is equivalent to this call to the LAPACK 
         auxiliary routine:   CALL SLASSQ( N, X, INCX, SCALE, SSQ ) */

      for (ix=(nn-1)*iincx; ix>=0; ix-=iincx)
      {
        if (x[ix] != 0.0)
        {
          absxi = fabs(x[ix]);
          if (scale < absxi)
          {
            temp = scale / absxi;
            ssq = ssq * (temp * temp) + 1.0;
            scale = absxi;
          }
          else
          {
            temp = absxi / scale;
            ssq += temp * temp;
          }
        }
      }
      norm = scale * sqrt(ssq);
    }
  }
  else
    norm = 0.0;

  return norm;

}